

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1502.c
# Opt level: O2

int test(char *URL)

{
  uint __i;
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  int *piVar6;
  int maxfd;
  int still_running;
  long curl_timeo;
  timeval timeout;
  int msgs_left;
  fd_set fdexcep;
  fd_set fdwrite;
  char redirect [160];
  
  sprintf(redirect,"google.com:%s:%s",libtest_arg2,libtest_arg3);
  fprintf(_stderr,"Redirect: %s\n",redirect);
  uVar2 = curl_slist_append(0,redirect);
  uVar3 = curl_easy_init();
  curl_easy_setopt(uVar3,0x2712,URL);
  curl_easy_setopt(uVar3,0x2a,1);
  curl_easy_setopt(uVar3,0x27db,uVar2);
  uVar4 = curl_multi_init();
  curl_multi_add_handle(uVar4,uVar3);
  curl_multi_perform(uVar4,&still_running);
  do {
    maxfd = -1;
    curl_timeo = -1;
    for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
      (&msgs_left + lVar5 * 2)[0] = 0;
      (&msgs_left + lVar5 * 2)[1] = 0;
    }
    for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
      fdwrite.__fds_bits[lVar5] = 0;
    }
    for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
      fdexcep.__fds_bits[lVar5] = 0;
    }
    timeout.tv_sec = 1;
    timeout.tv_usec = 0;
    curl_multi_timeout(uVar4,&curl_timeo);
    if (-1 < curl_timeo) {
      timeout.tv_sec = (ulong)curl_timeo / 1000;
      if ((ulong)curl_timeo < 2000) {
        lVar5 = curl_timeo + -1000;
        if ((ulong)curl_timeo < 1000) {
          lVar5 = curl_timeo;
        }
        timeout.tv_usec = lVar5 * 1000;
      }
      else {
        timeout.tv_sec = 1;
      }
    }
    curl_multi_fdset(uVar4,(fd_set *)&msgs_left,&fdwrite,&fdexcep,&maxfd);
    iVar1 = select(maxfd + 1,(fd_set *)&msgs_left,(fd_set *)&fdwrite,(fd_set *)&fdexcep,
                   (timeval *)&timeout);
    if (iVar1 != -1) {
      curl_multi_perform(uVar4,&still_running);
    }
  } while (still_running != 0);
  iVar1 = 4;
  while( true ) {
    piVar6 = (int *)curl_multi_info_read(uVar4,&msgs_left);
    if (piVar6 == (int *)0x0) break;
    if (*piVar6 == 1) {
      iVar1 = piVar6[4];
    }
  }
  curl_multi_cleanup(uVar4);
  curl_easy_cleanup(uVar3);
  curl_slist_free_all(uVar2);
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL *ehandle;
  CURLM *multi_handle;
  char redirect[160];
  CURLcode result = CURLE_NOT_BUILT_IN;
  int still_running; /* keep number of running handles */

  CURLMsg *msg; /* for picking up messages with the transfer status */
  int msgs_left; /* how many messages are left */

  /* DNS cache injection */
  struct curl_slist *dns_cache_list;

  sprintf(redirect, "google.com:%s:%s", libtest_arg2, libtest_arg3);

  fprintf(stderr, "Redirect: %s\n", redirect);

  dns_cache_list = curl_slist_append(NULL, redirect);

  /* Allocate one CURL handle per transfer */
  ehandle = curl_easy_init();

  /* set the options (I left out a few, you'll get the point anyway) */
  curl_easy_setopt(ehandle, CURLOPT_URL, URL);
  curl_easy_setopt(ehandle, CURLOPT_HEADER, 1L);

  curl_easy_setopt(ehandle, CURLOPT_RESOLVE, dns_cache_list);

  /* init a multi stack */
  multi_handle = curl_multi_init();

  /* add the individual transfers */
  curl_multi_add_handle(multi_handle, ehandle);

  /* we start some action by calling perform right away */
  curl_multi_perform(multi_handle, &still_running);

  do {
    struct timeval timeout;
    int rc; /* select() return code */

    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    int maxfd = -1;

    long curl_timeo = -1;

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    /* set a suitable timeout to play around with */
    timeout.tv_sec = 1;
    timeout.tv_usec = 0;

    curl_multi_timeout(multi_handle, &curl_timeo);
    if(curl_timeo >= 0) {
      timeout.tv_sec = curl_timeo / 1000;
      if(timeout.tv_sec > 1)
        timeout.tv_sec = 1;
      else
        timeout.tv_usec = (curl_timeo % 1000) * 1000;
    }

    /* get file descriptors from the transfers */
    curl_multi_fdset(multi_handle, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* In a real-world program you OF COURSE check the return code of the
       function calls.  On success, the value of maxfd is guaranteed to be
       greater or equal than -1.  We call select(maxfd + 1, ...), specially in
       case of (maxfd == -1), we call select(0, ...), which is basically equal
       to sleep. */

    rc = select(maxfd+1, &fdread, &fdwrite, &fdexcep, &timeout);

    switch(rc) {
    case -1:
      /* select error */
      break;
    case 0: /* timeout */
    default: /* action */
      curl_multi_perform(multi_handle, &still_running);
      break;
    }
  } while(still_running);

  /* See how the transfers went */
  while ((msg = curl_multi_info_read(multi_handle, &msgs_left))) {
    if (msg->msg == CURLMSG_DONE)
      result = msg->data.result;
  }

  curl_multi_cleanup(multi_handle);

  /* Free the CURL handles */
  curl_easy_cleanup(ehandle);

  curl_slist_free_all(dns_cache_list);

  return (int)result;
}